

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O1

void __thiscall
kratos::Const::Const(Const *this,Generator *generator,int64_t value,uint32_t width,bool is_signed)

{
  byte bVar1;
  Const *pCVar2;
  uint uVar3;
  int iVar4;
  UserException *pUVar5;
  undefined4 in_register_0000000c;
  ulong uVar6;
  undefined7 in_register_00000081;
  bool bVar7;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  aVar8;
  ulong uVar9;
  uint __len;
  uint32_t var_width;
  string_view format_str;
  string_view format_str_00;
  format_args args;
  format_args args_00;
  undefined1 local_a8 [8];
  string __str;
  string local_70;
  ulong local_50;
  Generator *local_48;
  uint local_3c;
  Const *local_38;
  
  local_50 = CONCAT44(in_register_0000000c,width);
  local_3c = (uint)CONCAT71(in_register_00000081,is_signed);
  uVar9 = -value;
  if (0 < value) {
    uVar9 = value;
  }
  __len = 1;
  if (9 < uVar9) {
    uVar6 = uVar9;
    uVar3 = 4;
    do {
      __len = uVar3;
      if (uVar6 < 100) {
        __len = __len - 2;
        goto LAB_00347833;
      }
      if (uVar6 < 1000) {
        __len = __len - 1;
        goto LAB_00347833;
      }
      if (uVar6 < 10000) goto LAB_00347833;
      bVar7 = 99999 < uVar6;
      uVar6 = uVar6 / 10000;
      uVar3 = __len + 4;
    } while (bVar7);
    __len = __len + 1;
  }
LAB_00347833:
  local_a8 = (undefined1  [8])&__str._M_string_length;
  local_48 = generator;
  local_38 = this;
  std::__cxx11::string::_M_construct((ulong)local_a8,(char)__len - (char)(value >> 0x3f));
  std::__detail::__to_chars_10_impl<unsigned_long>
            ((char *)((long)local_a8 + -(value >> 0x3f)),__len,uVar9);
  pCVar2 = local_38;
  uVar9 = local_50;
  aVar8._0_4_ = local_3c & 0xff;
  aVar8._4_4_ = 0;
  var_width = (uint32_t)local_50;
  bVar7 = SUB41(local_3c,0);
  Var::Var(&local_38->super_Var,local_48,(string *)local_a8,var_width,1,bVar7,ConstValue);
  if (local_a8 != (undefined1  [8])&__str._M_string_length) {
    operator_delete((void *)local_a8,__str._M_string_length + 1);
  }
  (pCVar2->super_Var).super_IRNode._vptr_IRNode = (_func_int **)&PTR_accept_004cf9b8;
  pCVar2->value_ = 0;
  (pCVar2->hex_value_)._M_dataplus._M_p = (pointer)&(pCVar2->hex_value_).field_2;
  (pCVar2->hex_value_)._M_string_length = 0;
  (pCVar2->hex_value_).field_2._M_local_buf[0] = '\0';
  pCVar2->num_bits_ = 0;
  pCVar2->negative_ = false;
  bVar1 = (byte)uVar9;
  if (bVar7 == false) {
    iVar4 = 2;
    if ((ulong)value >> (bVar1 & 0x3f) != 0 && var_width != 0x40) goto LAB_0034795b;
  }
  else {
    uVar6 = -1L << (bVar1 - 1 & 0x3f);
    if ((long)~uVar6 < value || value < (long)uVar6) {
      iVar4 = 2 - (uint)(value < (long)uVar6);
      goto LAB_0034795b;
    }
  }
  iVar4 = 0;
LAB_0034795b:
  if (iVar4 == 1) {
    pUVar5 = (UserException *)__cxa_allocate_exception(0x10);
    __str.field_2._8_8_ = uVar9 & 0xffffffff;
    format_str.size_ = 0x233;
    format_str.data_ = (char *)0x3b;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.values_ = aVar8.values_;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)local_a8;
    local_a8 = (undefined1  [8])value;
    __str._M_string_length = -1L << (bVar1 - 1 & 0x3f);
    fmt::v7::detail::vformat_abi_cxx11_
              (&local_70,(detail *)"{0} is smaller than the minimum value ({1}) given width {2}",
               format_str,args);
    UserException::UserException(pUVar5,&local_70);
    __cxa_throw(pUVar5,&UserException::typeinfo,std::runtime_error::~runtime_error);
  }
  if ((var_width < 0x41) && (iVar4 == 2)) {
    pUVar5 = (UserException *)__cxa_allocate_exception(0x10);
    format_str_00.size_ = 0x243;
    format_str_00.data_ = (char *)0x3a;
    args_00.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.values_ = aVar8.values_;
    args_00.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)local_a8;
    local_a8 = (undefined1  [8])value;
    __str._M_string_length = ~(-1L << (bVar1 & 0x3f));
    __str.field_2._8_8_ = uVar9 & 0xffffffff;
    fmt::v7::detail::vformat_abi_cxx11_
              (&local_70,(detail *)"{0} is larger than the maximum value ({1}) given width {2}",
               format_str_00,args_00);
    UserException::UserException(pUVar5,&local_70);
    __cxa_throw(pUVar5,&UserException::typeinfo,std::runtime_error::~runtime_error);
  }
  pCVar2->value_ = value;
  return;
}

Assistant:

Const::Const(Generator *generator, int64_t value, uint32_t width, bool is_signed)
    : Var(generator, std::to_string(value), width, 1, is_signed, VarType::ConstValue), value_() {
    // need to deal with the signed value
    auto is_legal = Const::is_legal(value, width, is_signed);
    if (is_legal == ConstantLegal::Small) {
        uint64_t temp = (~0ull) << (width - 1);
        int64_t min = 0;
        std::memcpy(&min, &temp, sizeof(min));
        throw UserException(::format("{0} is smaller than the minimum value ({1}) given width {2}",
                                     value, min, width));
    } else if (is_legal == ConstantLegal::Big && width <= 64) {
        uint64_t max = (1ull << width) - 1;
        uint64_t unsigned_value;
        std::memcpy(&unsigned_value, &value, sizeof(unsigned_value));
        throw UserException(::format("{0} is larger than the maximum value ({1}) given width {2}",
                                     value, max, width));
    }
    value_ = value;
}